

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O2

void qpdf_oh_append_item(qpdf_data qpdf,qpdf_oh oh,qpdf_oh item)

{
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._12_4_ = 0;
  local_28._8_4_ = item;
  local_10 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1618:31)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1618:31)>
             ::_M_manager;
  local_28._M_unused._M_object = qpdf;
  do_with_oh_void(qpdf,oh,(function<void_(QPDFObjectHandle_&)> *)&local_28);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  return;
}

Assistant:

void
qpdf_oh_append_item(qpdf_data qpdf, qpdf_oh oh, qpdf_oh item)
{
    do_with_oh_void(qpdf, oh, [qpdf, item](QPDFObjectHandle& o) {
        QTC::TC("qpdf", "qpdf-c called qpdf_oh_append_item");
        o.appendItem(qpdf_oh_item_internal(qpdf, item));
    });
}